

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::AddRuneToString(Regexp *this,Rune r)

{
  int iVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  ulong uVar4;
  void *pvVar5;
  undefined4 in_ESI;
  long in_RDI;
  int i;
  Rune *old;
  int local_1c;
  
  if (*(int *)(in_RDI + 0x18) == 0) {
    pvVar3 = operator_new__(0x20);
    *(void **)(in_RDI + 0x20) = pvVar3;
  }
  else if ((7 < *(int *)(in_RDI + 0x18)) &&
          ((*(uint *)(in_RDI + 0x18) & *(int *)(in_RDI + 0x18) - 1U) == 0)) {
    pvVar3 = *(void **)(in_RDI + 0x20);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(*(int *)(in_RDI + 0x18) << 1);
    uVar4 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    *(void **)(in_RDI + 0x20) = pvVar5;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x18); local_1c = local_1c + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x20) + (long)local_1c * 4) =
           *(undefined4 *)((long)pvVar3 + (long)local_1c * 4);
    }
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
  }
  iVar1 = *(int *)(in_RDI + 0x18);
  *(int *)(in_RDI + 0x18) = iVar1 + 1;
  *(undefined4 *)(*(long *)(in_RDI + 0x20) + (long)iVar1 * 4) = in_ESI;
  return;
}

Assistant:

void Regexp::AddRuneToString(Rune r) {
  DCHECK(op_ == kRegexpLiteralString);
  if (nrunes_ == 0) {
    // start with 8
    runes_ = new Rune[8];
  } else if (nrunes_ >= 8 && (nrunes_ & (nrunes_ - 1)) == 0) {
    // double on powers of two
    Rune *old = runes_;
    runes_ = new Rune[nrunes_ * 2];
    for (int i = 0; i < nrunes_; i++)
      runes_[i] = old[i];
    delete[] old;
  }

  runes_[nrunes_++] = r;
}